

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFortranParserImpl.cxx
# Opt level: O0

bool cmFortranParser_FilePop(cmFortranParser *parser)

{
  bool bVar1;
  reference pvVar2;
  YY_BUFFER_STATE b;
  YY_BUFFER_STATE current;
  undefined1 local_48 [8];
  cmFortranFile f;
  cmFortranParser *parser_local;
  
  f.Directory.field_2._8_8_ = parser;
  bVar1 = std::stack<cmFortranFile,_std::deque<cmFortranFile,_std::allocator<cmFortranFile>_>_>::
          empty(&parser->FileStack);
  if (!bVar1) {
    pvVar2 = std::stack<cmFortranFile,_std::deque<cmFortranFile,_std::allocator<cmFortranFile>_>_>::
             top((stack<cmFortranFile,_std::deque<cmFortranFile,_std::allocator<cmFortranFile>_>_> *
                 )(f.Directory.field_2._8_8_ + 0x20));
    cmFortranFile::cmFortranFile((cmFortranFile *)local_48,pvVar2);
    std::stack<cmFortranFile,_std::deque<cmFortranFile,_std::allocator<cmFortranFile>_>_>::pop
              ((stack<cmFortranFile,_std::deque<cmFortranFile,_std::allocator<cmFortranFile>_>_> *)
               (f.Directory.field_2._8_8_ + 0x20));
    fclose((FILE *)local_48);
    b = cmFortranLexer_GetCurrentBuffer(*(yyscan_t *)(f.Directory.field_2._8_8_ + 0x18));
    cmFortran_yy_delete_buffer(b,*(yyscan_t *)(f.Directory.field_2._8_8_ + 0x18));
    cmFortran_yy_switch_to_buffer
              ((YY_BUFFER_STATE)f.File,*(yyscan_t *)(f.Directory.field_2._8_8_ + 0x18));
    cmFortranFile::~cmFortranFile((cmFortranFile *)local_48);
  }
  parser_local._7_1_ = !bVar1;
  return parser_local._7_1_;
}

Assistant:

bool cmFortranParser_FilePop(cmFortranParser* parser)
{
  // Pop one file off the stack and close it.  Switch the lexer back
  // to the next one on the stack.
  if(parser->FileStack.empty())
    {
    return 0;
    }
  else
    {
    cmFortranFile f = parser->FileStack.top(); parser->FileStack.pop();
    fclose(f.File);
    YY_BUFFER_STATE current =
      cmFortranLexer_GetCurrentBuffer(parser->Scanner);
    cmFortran_yy_delete_buffer(current, parser->Scanner);
    cmFortran_yy_switch_to_buffer(f.Buffer, parser->Scanner);
    return 1;
    }
}